

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

ZoneHashEntry * __thiscall
AbbrHashEntry::search(AbbrHashEntry *this,int start_idx,ZoneSearchSpec *spec,ZoneHashEntry *zone)

{
  int i;
  ZoneHashEntry *zone_local;
  ZoneSearchSpec *spec_local;
  int start_idx_local;
  AbbrHashEntry *this_local;
  
  i = start_idx;
  while( true ) {
    if (*(int *)&(this->super_CVmHashEntryCI).super_CVmHashEntry.field_0x24 <= i) {
      return (ZoneHashEntry *)0x0;
    }
    if (((this->entries[i].zone == zone) && (this->entries[i].gmtofs == spec->gmtofs)) &&
       (this->entries[i].dst == spec->dst)) break;
    i = i + 1;
  }
  return this->entries[i].zone;
}

Assistant:

ZoneHashEntry *search(int start_idx, const ZoneSearchSpec *spec,
                          const ZoneHashEntry *zone)
    {
        for (int i = start_idx ; i < entry_cnt ; ++i)
        {
            if (entries[i].zone == zone
                && entries[i].gmtofs == spec->gmtofs
                && entries[i].dst == spec->dst)
                return entries[i].zone;
        }

        return 0;
    }